

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtoolbutton.cpp
# Opt level: O3

void QToolButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  ArrowType *pAVar2;
  undefined4 uVar3;
  long in_FS_OFFSET;
  undefined8 local_20;
  void *local_18;
  undefined8 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_20 = *_a[1];
      local_10 = &local_20;
      local_18 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_18);
      goto switchD_004bbba1_caseD_3;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        showMenu((QToolButton *)_o);
        return;
      }
      break;
    case 2:
      pAVar2 = (ArrowType *)_a[1];
switchD_004bbc0e_caseD_1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        setToolButtonStyle((QToolButton *)_o,*pAVar2);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        setDefaultAction((QToolButton *)_o,*_a[1]);
        return;
      }
      break;
    default:
      goto switchD_004bbba1_caseD_3;
    }
    goto LAB_004bbda3;
  case ReadProperty:
    if ((uint)_id < 4) {
      switch(_id) {
      case 0:
        uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x2e8);
        break;
      case 1:
        uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x2e4);
        break;
      case 2:
        *(byte *)*_a = *(byte *)(*(long *)(_o + 8) + 0x2ec) >> 3 & 1;
        goto switchD_004bbba1_caseD_3;
      case 3:
        uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x2e0);
      }
      *(undefined4 *)*_a = uVar3;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 4) {
      pAVar2 = (ArrowType *)*_a;
      switch(_id) {
      case 0:
        *(ArrowType *)(*(long *)(_o + 8) + 0x2e8) = *pAVar2;
        goto switchD_004bbba1_caseD_3;
      case 1:
        goto switchD_004bbc0e_caseD_1;
      case 2:
        *(byte *)(*(long *)(_o + 8) + 0x2ec) =
             *(byte *)(*(long *)(_o + 8) + 0x2ec) & 0xf7 | (char)*pAVar2 << 3;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          QWidget::update((QWidget *)_o);
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          setArrowType((QToolButton *)_o,*pAVar2);
          return;
        }
      }
      goto LAB_004bbda3;
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == triggered) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if ((_id == 0) || (_id == 3)) {
      puVar1 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar1 = &QtPrivate::QMetaTypeInterfaceWrapper<QAction_*>::metaType;
        break;
      }
    }
    else {
      puVar1 = (undefined8 *)*_a;
    }
    *puVar1 = 0;
  }
switchD_004bbba1_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_004bbda3:
  __stack_chk_fail();
}

Assistant:

void QToolButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QToolButton *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->triggered((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 1: _t->showMenu(); break;
        case 2: _t->setToolButtonStyle((*reinterpret_cast< std::add_pointer_t<Qt::ToolButtonStyle>>(_a[1]))); break;
        case 3: _t->setDefaultAction((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QToolButton::*)(QAction * )>(_a, &QToolButton::triggered, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<ToolButtonPopupMode*>(_v) = _t->popupMode(); break;
        case 1: *reinterpret_cast<Qt::ToolButtonStyle*>(_v) = _t->toolButtonStyle(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->autoRaise(); break;
        case 3: *reinterpret_cast<Qt::ArrowType*>(_v) = _t->arrowType(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setPopupMode(*reinterpret_cast<ToolButtonPopupMode*>(_v)); break;
        case 1: _t->setToolButtonStyle(*reinterpret_cast<Qt::ToolButtonStyle*>(_v)); break;
        case 2: _t->setAutoRaise(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setArrowType(*reinterpret_cast<Qt::ArrowType*>(_v)); break;
        default: break;
        }
    }
}